

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O0

void __thiscall
GameEngine::fillPopulationPattern
          (GameEngine *this,vector<LightPopulation,_std::allocator<LightPopulation>_> *populations)

{
  bool bVar1;
  __shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  size_t sVar3;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *this_01;
  RandomGenerator *pRVar4;
  element_type *peVar5;
  ostream *poVar6;
  void *pvVar7;
  element_type *peVar8;
  vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_> *this_02;
  __shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  element_type *this_04;
  shared_ptr<Population> local_78;
  ulong local_68;
  size_t step;
  int32_t x;
  int32_t y;
  shared_ptr<Population> *population;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *__range2;
  shared_ptr<Player> *player;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_> *__range1;
  vector<LightPopulation,_std::allocator<LightPopulation>_> *populations_local;
  GameEngine *this_local;
  
  __end1 = std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::begin
                     (&this->players);
  player = (shared_ptr<Player> *)
           std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>::end
                     (&this->players);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
                                     *)&player), bVar1) {
    this_00 = (__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
              ::operator*(&__end1);
    peVar2 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (this_00);
    sVar3 = Player::getPopulationsNumber(peVar2);
    if (sVar3 == 0) {
      peVar2 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      Player::generatePopulations(peVar2);
    }
    peVar2 = std::__shared_ptr_access<Player,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       (this_00);
    this_01 = Player::GetPlayerPopulations(peVar2);
    __end2 = std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
             ::begin(this_01);
    population = (shared_ptr<Population> *)
                 std::
                 vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                 ::end(this_01);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
                                       *)&population), bVar1) {
      _x = (__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           __gnu_cxx::
           __normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
           ::operator*(&__end2);
      pRVar4 = RandomGenerator::getInstance();
      peVar5 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                         );
      sVar3 = Map::getHeight(peVar5);
      step._4_4_ = RandomGenerator::randInt(pRVar4,0,(int)sVar3 + -1);
      pRVar4 = RandomGenerator::getInstance();
      peVar5 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                         );
      sVar3 = Map::getWidth(peVar5);
      step._0_4_ = RandomGenerator::randInt(pRVar4,0,(int)sVar3 + -1);
      local_68 = 0;
      while (bVar1 = isPopulationExist(this,(long)(int32_t)step,(long)step._4_4_),
            bVar1 && local_68 < 10) {
        pRVar4 = RandomGenerator::getInstance();
        peVar5 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            this);
        sVar3 = Map::getHeight(peVar5);
        step._4_4_ = RandomGenerator::randInt(pRVar4,0,(int)sVar3 + -1);
        pRVar4 = RandomGenerator::getInstance();
        peVar5 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            this);
        sVar3 = Map::getWidth(peVar5);
        step._0_4_ = RandomGenerator::randInt(pRVar4,0,(int)sVar3 + -1);
        poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(int32_t)step);
        poVar6 = std::operator<<(poVar6," ");
        pvVar7 = (void *)std::ostream::operator<<(poVar6,step._4_4_);
        std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
        local_68 = local_68 + 1;
      }
      poVar6 = std::operator<<((ostream *)&std::cout," End ");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(int32_t)step);
      poVar6 = std::operator<<(poVar6," ");
      pvVar7 = (void *)std::ostream::operator<<(poVar6,step._4_4_);
      std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
      if (local_68 == 10) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Cannot generate populations");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      peVar8 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(_x);
      Population::SetXPos(peVar8,(int32_t)step);
      peVar8 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(_x);
      Population::SetYPos(peVar8,step._4_4_);
      peVar5 = std::__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                         ((__shared_ptr_access<Map,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this
                         );
      this_02 = Map::operator[](peVar5,(long)step._4_4_);
      this_03 = (__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::vector<std::shared_ptr<CellType>,_std::allocator<std::shared_ptr<CellType>_>_>
                ::operator[](this_02,(long)(int32_t)step);
      this_04 = std::__shared_ptr_access<CellType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->(this_03);
      std::shared_ptr<Population>::shared_ptr(&local_78,(shared_ptr<Population> *)_x);
      CellType::setCurrentPopulation(this_04,&local_78);
      std::shared_ptr<Population>::~shared_ptr(&local_78);
      peVar8 = std::__shared_ptr_access<Population,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator*(_x);
      std::vector<LightPopulation,std::allocator<LightPopulation>>::emplace_back<Population&>
                ((vector<LightPopulation,std::allocator<LightPopulation>> *)populations,peVar8);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Population>_*,_std::vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Player>_*,_std::vector<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void GameEngine::fillPopulationPattern(std::vector<LightPopulation> &populations) {
  for (const auto &player : players) {
    if (player->getPopulationsNumber() == 0) {
      player->generatePopulations();
    }

    for (const auto &population : player->GetPlayerPopulations()) {
      int32_t y = RandomGenerator::getInstance().randInt(0, map->getHeight() - 1);
      int32_t x = RandomGenerator::getInstance().randInt(0, map->getWidth() - 1);
      size_t step = 0;

      while (isPopulationExist(x, y) && step < 10) {
        y = RandomGenerator::getInstance().randInt(0, map->getHeight() - 1);
        x = RandomGenerator::getInstance().randInt(0, map->getWidth() - 1);
        std::cout << x << " " << y << std::endl;
        ++step;
      }
      std::cout << " End " << std::endl;
      std::cout << x << " " << y << std::endl;

      if (step == 10) {
        std::cerr << "Cannot generate populations" << std::endl;
      }

      population->SetXPos(x);
      population->SetYPos(y);
      (*map)[y][x]->setCurrentPopulation(population);

      populations.emplace_back(*population);
    }
  }
}